

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O2

void __thiscall
ncnn::DeformableConv2D_x86_fma::DeformableConv2D_x86_fma(DeformableConv2D_x86_fma *this)

{
  DeformableConv2D::DeformableConv2D((DeformableConv2D *)&this->field_0x60);
  this->_vptr_DeformableConv2D_x86_fma = (_func_int **)0x58e870;
  *(undefined8 *)&this->field_0x60 = 0x58e8f0;
  (this->weight_data_tm).cstep = 0;
  this->gemm = (Layer *)0x0;
  (this->weight_data_tm).data = (void *)0x0;
  (this->weight_data_tm).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  this->field_0x6b = 1;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

DeformableConv2D_x86_fma::DeformableConv2D_x86_fma()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}